

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int av1_refining_search_8p_c
              (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,FULLPEL_MV start_mv,FULLPEL_MV *best_mv)

{
  int ref_stride;
  buf_2d *pbVar1;
  buf_2d *src;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  int best_site;
  ulong uVar6;
  int j;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  FULLPEL_MV mv;
  FULLPEL_MV FVar10;
  FULLPEL_MV local_c4;
  FULLPEL_MV *local_c0;
  ulong local_b8;
  MV_COST_PARAMS *local_b0;
  buf_2d *local_a8;
  buf_2d *local_a0;
  FULLPEL_MOTION_SEARCH_PARAMS *local_98;
  FullMvLimits *local_90;
  uint8_t do_refine_search_grid [49];
  
  do_refine_search_grid[0x20] = '\0';
  do_refine_search_grid[0x21] = '\0';
  do_refine_search_grid[0x22] = '\0';
  do_refine_search_grid[0x23] = '\0';
  do_refine_search_grid[0x24] = '\0';
  do_refine_search_grid[0x25] = '\0';
  do_refine_search_grid[0x26] = '\0';
  do_refine_search_grid[0x27] = '\0';
  do_refine_search_grid[0x28] = '\0';
  do_refine_search_grid[0x29] = '\0';
  do_refine_search_grid[0x2a] = '\0';
  do_refine_search_grid[0x2b] = '\0';
  do_refine_search_grid[0x2c] = '\0';
  do_refine_search_grid[0x2d] = '\0';
  do_refine_search_grid[0x2e] = '\0';
  do_refine_search_grid[0x2f] = '\0';
  do_refine_search_grid[0x10] = '\0';
  do_refine_search_grid[0x11] = '\0';
  do_refine_search_grid[0x12] = '\0';
  do_refine_search_grid[0x13] = '\0';
  do_refine_search_grid[0x14] = '\0';
  do_refine_search_grid[0x15] = '\0';
  do_refine_search_grid[0x16] = '\0';
  do_refine_search_grid[0x17] = '\0';
  do_refine_search_grid[0x18] = '\0';
  do_refine_search_grid[0x19] = '\0';
  do_refine_search_grid[0x1a] = '\0';
  do_refine_search_grid[0x1b] = '\0';
  do_refine_search_grid[0x1c] = '\0';
  do_refine_search_grid[0x1d] = '\0';
  do_refine_search_grid[0x1e] = '\0';
  do_refine_search_grid[0x1f] = '\0';
  do_refine_search_grid[0] = '\0';
  do_refine_search_grid[1] = '\0';
  do_refine_search_grid[2] = '\0';
  do_refine_search_grid[3] = '\0';
  do_refine_search_grid[4] = '\0';
  do_refine_search_grid[5] = '\0';
  do_refine_search_grid[6] = '\0';
  do_refine_search_grid[7] = '\0';
  do_refine_search_grid[8] = '\0';
  do_refine_search_grid[9] = '\0';
  do_refine_search_grid[10] = '\0';
  do_refine_search_grid[0xb] = '\0';
  do_refine_search_grid[0xc] = '\0';
  do_refine_search_grid[0xd] = '\0';
  do_refine_search_grid[0xe] = '\0';
  do_refine_search_grid[0xf] = '\0';
  do_refine_search_grid[0x30] = '\0';
  local_90 = &ms_params->mv_limits;
  pbVar1 = (ms_params->ms_buffers).ref;
  src = (ms_params->ms_buffers).src;
  ref_stride = pbVar1->stride;
  *best_mv = start_mv;
  clamp_fullmv(best_mv,local_90);
  local_a8 = src;
  local_a0 = pbVar1;
  local_98 = ms_params;
  iVar2 = get_mvpred_compound_sad
                    (ms_params,src,
                     pbVar1->buf + (long)best_mv->col + (long)best_mv->row * (long)pbVar1->stride,
                     ref_stride);
  local_c0 = best_mv;
  local_b0 = &ms_params->mv_cost_params;
  iVar3 = mvsad_err_cost_(best_mv,&ms_params->mv_cost_params);
  uVar8 = iVar3 + iVar2;
  do_refine_search_grid[0x18] = '\x01';
  uVar4 = 0;
  iVar2 = 0x18;
  while( true ) {
    local_b8 = (ulong)uVar4;
    if (uVar4 == 3) {
      return uVar8;
    }
    uVar6 = 0xffffffffffffffff;
    for (uVar7 = 0; uVar7 != 8; uVar7 = uVar7 + 1) {
      lVar5 = (long)av1_refining_search_8p_c::neighbors[uVar7].coord_offset + (long)iVar2;
      if (do_refine_search_grid[lVar5] != '\x01') {
        mv.row = av1_refining_search_8p_c::neighbors[uVar7].coord + (*local_c0).row;
        mv.col = SUB82(av1_refining_search_8p_c::neighbors[uVar7],2) + (*local_c0).col;
        do_refine_search_grid[lVar5] = '\x01';
        local_c4 = mv;
        iVar3 = av1_is_fullmv_in_range(local_90,mv);
        if ((iVar3 != 0) &&
           (uVar4 = get_mvpred_compound_sad
                              (local_98,local_a8,
                               local_a0->buf + ((int)mv.col + (int)mv.row * local_a0->stride),
                               ref_stride), uVar4 < uVar8)) {
          iVar3 = mvsad_err_cost_(&local_c4,local_b0);
          uVar4 = iVar3 + uVar4;
          bVar9 = uVar4 < uVar8;
          if (bVar9) {
            uVar8 = uVar4;
          }
          uVar6 = uVar6 & 0xffffffff;
          if (bVar9) {
            uVar6 = uVar7 & 0xffffffff;
          }
        }
      }
    }
    iVar3 = (int)uVar6;
    if (iVar3 == -1) break;
    FVar10.row = (*local_c0).row + av1_refining_search_8p_c::neighbors[iVar3].coord;
    FVar10.col = (*local_c0).col + SUB82(av1_refining_search_8p_c::neighbors[iVar3],2);
    *local_c0 = FVar10;
    iVar2 = iVar2 + av1_refining_search_8p_c::neighbors[iVar3].coord_offset;
    uVar4 = (int)local_b8 + 1;
  }
  return uVar8;
}

Assistant:

int av1_refining_search_8p_c(const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                             const FULLPEL_MV start_mv, FULLPEL_MV *best_mv) {
  static const search_neighbors neighbors[8] = {
    { { -1, 0 }, -1 * SEARCH_GRID_STRIDE_8P + 0 },
    { { 0, -1 }, 0 * SEARCH_GRID_STRIDE_8P - 1 },
    { { 0, 1 }, 0 * SEARCH_GRID_STRIDE_8P + 1 },
    { { 1, 0 }, 1 * SEARCH_GRID_STRIDE_8P + 0 },
    { { -1, -1 }, -1 * SEARCH_GRID_STRIDE_8P - 1 },
    { { 1, -1 }, 1 * SEARCH_GRID_STRIDE_8P - 1 },
    { { -1, 1 }, -1 * SEARCH_GRID_STRIDE_8P + 1 },
    { { 1, 1 }, 1 * SEARCH_GRID_STRIDE_8P + 1 }
  };

  uint8_t do_refine_search_grid[SEARCH_GRID_STRIDE_8P *
                                SEARCH_GRID_STRIDE_8P] = { 0 };
  int grid_center = SEARCH_GRID_CENTER_8P;
  int grid_coord = grid_center;

  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const FullMvLimits *mv_limits = &ms_params->mv_limits;
  const MSBuffers *ms_buffers = &ms_params->ms_buffers;
  const struct buf_2d *src = ms_buffers->src;
  const struct buf_2d *ref = ms_buffers->ref;
  const int ref_stride = ref->stride;

  *best_mv = start_mv;
  clamp_fullmv(best_mv, mv_limits);

  unsigned int best_sad = get_mvpred_compound_sad(
      ms_params, src, get_buf_from_fullmv(ref, best_mv), ref_stride);
  best_sad += mvsad_err_cost_(best_mv, mv_cost_params);

  do_refine_search_grid[grid_coord] = 1;

  for (int i = 0; i < SEARCH_RANGE_8P; ++i) {
    int best_site = -1;

    for (int j = 0; j < 8; ++j) {
      grid_coord = grid_center + neighbors[j].coord_offset;
      if (do_refine_search_grid[grid_coord] == 1) {
        continue;
      }
      const FULLPEL_MV mv = { best_mv->row + neighbors[j].coord.row,
                              best_mv->col + neighbors[j].coord.col };

      do_refine_search_grid[grid_coord] = 1;
      if (av1_is_fullmv_in_range(mv_limits, mv)) {
        unsigned int sad;
        sad = get_mvpred_compound_sad(
            ms_params, src, get_buf_from_fullmv(ref, &mv), ref_stride);
        if (sad < best_sad) {
          sad += mvsad_err_cost_(&mv, mv_cost_params);

          if (sad < best_sad) {
            best_sad = sad;
            best_site = j;
          }
        }
      }
    }

    if (best_site == -1) {
      break;
    } else {
      best_mv->row += neighbors[best_site].coord.row;
      best_mv->col += neighbors[best_site].coord.col;
      grid_center += neighbors[best_site].coord_offset;
    }
  }
  return best_sad;
}